

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O2

LispPTR UFS_directorynamep(LispPTR *args)

{
  uint uVar1;
  int iVar2;
  LispPTR LVar3;
  LispPTR *pLVar4;
  long lVar5;
  int *piVar6;
  size_t x;
  long lVar7;
  DLword *pDVar8;
  stat sbuf;
  char dirname [4096];
  char fullname [4096];
  
  iVar2 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar2 != 0) {
    *Lisp_errno = 100;
    return 0;
  }
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);
  pLVar4 = NativeAligned4FromLAddr(*args);
  if (*(char *)((long)pLVar4 + 6) == 'D') {
    LVar3 = pLVar4[2] * 2;
  }
  else {
    if (*(char *)((long)pLVar4 + 6) != 'C') {
      error("LispStringLength: Not a character array.\n");
      goto LAB_0012efdc;
    }
    LVar3 = pLVar4[2];
  }
  if ((long)(int)LVar3 - 0xffeU < 0xfffffffffffff001) {
    *Lisp_errno = 200;
    return 0;
  }
LAB_0012efdc:
  pLVar4 = NativeAligned4FromLAddr(*args);
  LVar3 = 0x1000;
  if ((int)pLVar4[2] < 0x1000) {
    LVar3 = pLVar4[2];
  }
  lVar5 = (long)(int)LVar3;
  if (*(char *)((long)pLVar4 + 6) == 'D') {
    pDVar8 = Lisp_world + (ulong)(ushort)pLVar4[1] + (ulong)(*pLVar4 & 0xfffffff);
    for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
      dirname[lVar7] = *(char *)((ulong)pDVar8 ^ 2);
      pDVar8 = pDVar8 + 1;
    }
    dirname[lVar7] = '\0';
  }
  else if (*(char *)((long)pLVar4 + 6) == 'C') {
    uVar1 = *pLVar4;
    LVar3 = pLVar4[1];
    for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
      dirname[lVar7] =
           *(char *)((long)Lisp_world +
                     lVar7 + (ulong)(ushort)LVar3 + (ulong)(uVar1 & 0xfffffff) * 2 ^ 3);
    }
    dirname[lVar5] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  iVar2 = unixpathname(dirname,fullname,0,0);
  if (iVar2 != 0) {
    alarm(TIMEOUT_TIME);
    piVar6 = __errno_location();
    do {
      *piVar6 = 0;
      iVar2 = stat(fullname,(stat *)&sbuf);
      if (iVar2 != -1) {
        alarm(0);
        if ((sbuf.st_mode & 0xf000) != 0x4000) {
          return 0;
        }
        lisppathname(fullname,dirname,1,0);
        x = strlen(dirname);
        pLVar4 = NativeAligned4FromLAddr(args[1]);
        pDVar8 = Lisp_world;
        uVar1 = *pLVar4;
        for (lVar5 = 0; x + 1 != lVar5; lVar5 = lVar5 + 1) {
          *(char *)((long)pDVar8 + lVar5 + (ulong)((uVar1 & 0xfffffff) * 2) ^ 3) = dirname[lVar5];
        }
        LVar3 = GetSmallp(x);
        return LVar3;
      }
    } while (*piVar6 == 4);
    alarm(0);
    *Lisp_errno = *piVar6;
  }
  return 0;
}

Assistant:

LispPTR UFS_directorynamep(LispPTR *args)
{
  char dirname[MAXPATHLEN];
  char fullname[MAXPATHLEN];
  size_t len;
  int rval;
  char *base;
  struct stat sbuf;

  ERRSETJMP(NIL);
  Lisp_errno = (int *)(NativeAligned4FromLAddr(args[2]));

  LispStringLength(args[0], len, rval);
  len += 1;
  /* -2 for the initial and trail directory delimiter. */
  if (len > MAXPATHLEN - 2) FileNameTooLong(NIL);

  LispStringToCString(args[0], dirname, MAXPATHLEN);

/* Convert Xerox Lisp file naming convention to Unix one. */
#ifdef DOS
  if (unixpathname(dirname, fullname, 0, 0, 0, 0, 0) == 0) return (NIL);
#else
  if (unixpathname(dirname, fullname, 0, 0) == 0) return (NIL);
#endif /* DOS */

  TIMEOUT(rval = stat(fullname, &sbuf));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

  if (!S_ISDIR(sbuf.st_mode)) return (NIL);

  /* Convert Unix file naming convention to Xerox Lisp one. */
  if (lisppathname(fullname, dirname, 1, 0) == 0) return (NIL);

  len = strlen(dirname);
  STRING_BASE(args[1], base);

#ifndef BYTESWAP
  strncpy(base, dirname, len + 1);
#else
  StrNCpyFromCToLisp(base, dirname, len + 1);
#endif /* BYTESWAP */

  return (GetSmallp(len));
}